

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreateDxf.cpp
# Opt level: O0

void __thiscall CreateDxf::DxfBegin(CreateDxf *this,string *str)

{
  ostream *poVar1;
  ostream local_218 [8];
  ofstream To_Dxf;
  string *str_local;
  CreateDxf *this_local;
  
  std::ofstream::ofstream(local_218,(string *)str,_S_out);
  poVar1 = (ostream *)std::ostream::operator<<(local_218,0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_218,"SECTION");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(local_218,2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(local_218,"ENTITIES");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void  CreateDxf::DxfBegin (string &str)
{
	// Creation of an output stream object in text mode. Header section of every dxf file. 
	ofstream To_Dxf (str, ios::out);

	To_Dxf << 0		  << endl;
	To_Dxf << "SECTION"  << endl;
	To_Dxf << 2		  << endl;
	To_Dxf << "ENTITIES" << endl;

	To_Dxf.close();
}